

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

void __thiscall leveldb::_Test_MinorCompactionsHappen::_Run(_Test_MinorCompactionsHappen *this)

{
  Snapshot local_900 [4];
  undefined1 local_8e0 [40];
  string local_8b8 [32];
  leveldb local_898 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_878 [32];
  Tester local_858;
  int local_6b4;
  int i_2;
  undefined1 local_690 [40];
  string local_668 [32];
  leveldb local_648 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628 [32];
  Tester local_608;
  int local_464;
  undefined1 local_460 [4];
  int i_1;
  int local_2c0;
  allocator local_2b9;
  int ending_num_tables;
  leveldb local_298 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278 [48];
  leveldb local_248 [32];
  undefined1 local_228 [428];
  int local_7c;
  int local_78;
  int i;
  int starting_num_tables;
  int N;
  Options options;
  _Test_MinorCompactionsHappen *this_local;
  
  options.filter_policy = (FilterPolicy *)this;
  DBTest::CurrentOptions((Options *)&starting_num_tables,&this->super_DBTest);
  options.info_log = (Logger *)0x2710;
  DBTest::Reopen(&this->super_DBTest,(Options *)&starting_num_tables);
  i = 500;
  local_78 = DBTest::TotalTableFiles(&this->super_DBTest);
  for (local_7c = 0; local_7c < 500; local_7c = local_7c + 1) {
    test::Tester::Tester
              ((Tester *)(local_228 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x40c);
    Key_abi_cxx11_(local_248,local_7c);
    Key_abi_cxx11_(local_298,local_7c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&ending_num_tables,1000,'v',&local_2b9);
    std::operator+(local_278,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298);
    DBTest::Put((DBTest *)local_228,(string *)this,(string *)local_248);
    test::Tester::IsOk((Tester *)(local_228 + 8),(Status *)local_228);
    Status::~Status((Status *)local_228);
    std::__cxx11::string::~string((string *)local_278);
    std::__cxx11::string::~string((string *)&ending_num_tables);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
    std::__cxx11::string::~string((string *)local_298);
    std::__cxx11::string::~string((string *)local_248);
    test::Tester::~Tester((Tester *)(local_228 + 8));
  }
  local_2c0 = DBTest::TotalTableFiles(&this->super_DBTest);
  test::Tester::Tester
            ((Tester *)local_460,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x40f);
  test::Tester::IsGt<int,int>((Tester *)local_460,&local_2c0,&local_78);
  test::Tester::~Tester((Tester *)local_460);
  for (local_464 = 0; local_464 < 500; local_464 = local_464 + 1) {
    test::Tester::Tester
              (&local_608,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x412);
    Key_abi_cxx11_(local_648,local_464);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_668,1000,'v',(allocator *)(local_690 + 0x27));
    std::operator+(local_628,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_648);
    Key_abi_cxx11_((leveldb *)&stack0xfffffffffffff950,local_464);
    DBTest::Get((DBTest *)local_690,(string *)this,(Snapshot *)&stack0xfffffffffffff950);
    test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>
              (&local_608,local_628,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_690);
    std::__cxx11::string::~string((string *)local_690);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffff950);
    std::__cxx11::string::~string((string *)local_628);
    std::__cxx11::string::~string(local_668);
    std::allocator<char>::~allocator((allocator<char> *)(local_690 + 0x27));
    std::__cxx11::string::~string((string *)local_648);
    test::Tester::~Tester(&local_608);
  }
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  for (local_6b4 = 0; local_6b4 < 500; local_6b4 = local_6b4 + 1) {
    test::Tester::Tester
              (&local_858,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x418);
    Key_abi_cxx11_(local_898,local_6b4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_8b8,1000,'v',(allocator *)(local_8e0 + 0x27));
    std::operator+(local_878,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_898);
    Key_abi_cxx11_((leveldb *)local_900,local_6b4);
    DBTest::Get((DBTest *)local_8e0,(string *)this,local_900);
    test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>
              (&local_858,local_878,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8e0);
    std::__cxx11::string::~string((string *)local_8e0);
    std::__cxx11::string::~string((string *)local_900);
    std::__cxx11::string::~string((string *)local_878);
    std::__cxx11::string::~string(local_8b8);
    std::allocator<char>::~allocator((allocator<char> *)(local_8e0 + 0x27));
    std::__cxx11::string::~string((string *)local_898);
    test::Tester::~Tester(&local_858);
  }
  return;
}

Assistant:

TEST(DBTest, MinorCompactionsHappen) {
  Options options = CurrentOptions();
  options.write_buffer_size = 10000;
  Reopen(&options);

  const int N = 500;

  int starting_num_tables = TotalTableFiles();
  for (int i = 0; i < N; i++) {
    ASSERT_OK(Put(Key(i), Key(i) + std::string(1000, 'v')));
  }
  int ending_num_tables = TotalTableFiles();
  ASSERT_GT(ending_num_tables, starting_num_tables);

  for (int i = 0; i < N; i++) {
    ASSERT_EQ(Key(i) + std::string(1000, 'v'), Get(Key(i)));
  }

  Reopen();

  for (int i = 0; i < N; i++) {
    ASSERT_EQ(Key(i) + std::string(1000, 'v'), Get(Key(i)));
  }
}